

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O2

void __thiscall
Random_keys::cruzamento3
          (Random_keys *this,RK_Individual *pai1,RK_Individual *pai2,RK_Individual *filho)

{
  double dVar1;
  double *pdVar2;
  pointer __first;
  pointer __last;
  ulong uVar3;
  reference ppCVar4;
  unsigned_long i_1;
  unsigned_long i;
  ulong __n;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  __last = RK_Individual::cromossomos.
           super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __first = RK_Individual::cromossomos.
            super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  __n = 0;
  uVar3 = time((time_t *)0x0);
  local_38._M_x = uVar3 % 0x7fffffff + (ulong)(uVar3 % 0x7fffffff == 0);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )__first,
             (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )__last,&local_38);
  while( true ) {
    uVar3 = (ulong)((long)RK_Individual::cromossomos.
                          super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)RK_Individual::cromossomos.
                          super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) >> 1;
    if (uVar3 <= __n) break;
    pdVar2 = pai1->weights;
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,__n);
    dVar1 = pdVar2[(*ppCVar4)->position];
    pdVar2 = filho->weights;
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,__n);
    pdVar2[(*ppCVar4)->position] = dVar1;
    __n = __n + 1;
  }
  for (; uVar3 < (ulong)((long)RK_Individual::cromossomos.
                               super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)RK_Individual::cromossomos.
                               super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    pdVar2 = pai2->weights;
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,uVar3);
    dVar1 = pdVar2[(*ppCVar4)->position];
    pdVar2 = filho->weights;
    ppCVar4 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        (&RK_Individual::cromossomos,uVar3);
    pdVar2[(*ppCVar4)->position] = dVar1;
  }
  return;
}

Assistant:

void Random_keys::cruzamento3(RK_Individual *pai1, RK_Individual *pai2, RK_Individual *filho) {
    shuffle(RK_Individual::cromossomos.begin(), RK_Individual::cromossomos.end(), std::default_random_engine(time(NULL)));

    for(unsigned long int i=0; i<RK_Individual::cromossomos.size()/2; i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = pai1->getWeights()[RK_Individual::cromossomos.at(i)->position];

    for(unsigned long int i=RK_Individual::cromossomos.size()/2; i<RK_Individual::cromossomos.size(); i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = pai2->getWeights()[RK_Individual::cromossomos.at(i)->position];

}